

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

CloudNode * Cloud_bddOr(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudNode *pCVar1;
  
  if ((f < (CloudNode *)0x2) || (g < (CloudNode *)0x2)) {
    pCVar1 = (CloudNode *)0x0;
  }
  else {
    pCVar1 = dd->tUnique;
    if ((f < pCVar1) || (pCVar1 + dd->nNodesAlloc <= f)) {
      __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                    ,0x204,"CloudNode *Cloud_bddOr(CloudManager *, CloudNode *, CloudNode *)");
    }
    if ((g < pCVar1) || (pCVar1 + dd->nNodesAlloc <= g)) {
      __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                    ,0x205,"CloudNode *Cloud_bddOr(CloudManager *, CloudNode *, CloudNode *)");
    }
    if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
      cloudCacheAllocate(dd,CLOUD_OPER_AND);
    }
    pCVar1 = cloudBddAnd_gate(dd,(CloudNode *)((ulong)f ^ 1),(CloudNode *)((ulong)g ^ 1));
    pCVar1 = (CloudNode *)((ulong)(pCVar1 != (CloudNode *)0x0) ^ (ulong)pCVar1);
  }
  return pCVar1;
}

Assistant:

CloudNode * Cloud_bddOr( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * res;
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    res = cloudBddAnd_gate( dd, Cloud_Not(f), Cloud_Not(g) );
    res = Cloud_NotCond( res, res != NULL );
    return res;
}